

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  uint uVar1;
  Fault f;
  ListElementCount local_2c;
  ulong local_28;
  
  local_28 = expected._M_len;
  if (reader.builder.elementCount == local_28) {
    for (uVar1 = 0; uVar1 < local_28; uVar1 = uVar1 + 1) {
      checkElement<bool>(expected._M_array[uVar1],
                         (reader.builder.ptr[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0);
    }
    return;
  }
  local_2c = reader.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_28,&local_2c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}